

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AddGhostJoin(Clipper *this,OutPt *op,IntPoint OffPt)

{
  Join *this_00;
  Join *local_30;
  Join *j;
  OutPt *op_local;
  Clipper *this_local;
  IntPoint OffPt_local;
  
  OffPt_local.X = OffPt.Y;
  this_local = (Clipper *)OffPt.X;
  j = (Join *)op;
  op_local = (OutPt *)this;
  this_00 = (Join *)operator_new(0x20);
  Join::Join(this_00);
  this_00->OutPt1 = (OutPt *)j;
  this_00->OutPt2 = (OutPt *)0x0;
  (this_00->OffPt).X = (cInt)this_local;
  (this_00->OffPt).Y = OffPt_local.X;
  local_30 = this_00;
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::push_back
            (&this->m_GhostJoins,&local_30);
  return;
}

Assistant:

void Clipper::AddGhostJoin(OutPt *op, const IntPoint OffPt)
{
  Join* j = new Join;
  j->OutPt1 = op;
  j->OutPt2 = 0;
  j->OffPt = OffPt;
  m_GhostJoins.push_back(j);
}